

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_UdevDevice.h
# Opt level: O1

bool __thiscall
axl::sys::lnx::UdevDevice::createFromSysPath(UdevDevice *this,udev *ctx,StringRef *path)

{
  undefined *puVar1;
  C *pCVar2;
  udev_device *puVar3;
  
  puVar1 = libudev::udev_device_new_from_syspath;
  if (path->m_length == 0) {
    pCVar2 = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  else {
    pCVar2 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated(path);
  }
  puVar3 = (udev_device *)(*(code *)puVar1)(ctx,pCVar2);
  if ((this->
      super_Handle<axl::sys::lnx::libudev::udev_device_*,_axl::sys::lnx::UnrefUdevDevice,_axl::sl::Zero<axl::sys::lnx::libudev::udev_device_*>_>
      ).m_h != (udev_device *)0x0) {
    (*(code *)libudev::udev_device_unref)();
    (this->
    super_Handle<axl::sys::lnx::libudev::udev_device_*,_axl::sys::lnx::UnrefUdevDevice,_axl::sl::Zero<axl::sys::lnx::libudev::udev_device_*>_>
    ).m_h = (udev_device *)0x0;
  }
  (this->
  super_Handle<axl::sys::lnx::libudev::udev_device_*,_axl::sys::lnx::UnrefUdevDevice,_axl::sl::Zero<axl::sys::lnx::libudev::udev_device_*>_>
  ).m_h = puVar3;
  if (puVar3 == (udev_device *)0x0) {
    err::setFormatStringError("libudev failed: %s","udev_device_new_from_syspath");
  }
  return puVar3 != (udev_device *)0x0;
}

Assistant:

bool
	createFromSysPath(
		udev* ctx,
		const sl::StringRef& path
	) {
		attach(udev_device_new_from_syspath(ctx, path.sz()));
		return completeUdev(m_h, "udev_device_new_from_syspath");
	}